

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O0

vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
* __thiscall OpenMD::PropertyMap::getProperties(PropertyMap *this)

{
  bool bVar1;
  value_type *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  *in_RDI;
  iterator iter;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  *properties;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  *this_00;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  ::vector((vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
            *)0x39f90e);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
             ::begin(in_RDI);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
         ::end(in_RDI);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
                  *)0x39f967);
    std::
    vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
    ::push_back(in_stack_ffffffffffffffc0,in_RSI);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>
                  *)this_00);
  }
  return (vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
          *)this_00;
}

Assistant:

std::vector<std::shared_ptr<GenericData>> PropertyMap::getProperties() {
    std::vector<std::shared_ptr<GenericData>> properties;
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    for (iter = propMap_.begin(); iter != propMap_.end(); ++iter)
      properties.push_back(iter->second);

    return properties;
  }